

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageFormat(Image *image,int newFormat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Image image_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Vector4 *__ptr;
  void *pvVar9;
  int iVar10;
  long lVar11;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  float fVar12;
  int local_68;
  int local_64;
  int k_4;
  int i_9;
  int k_3;
  int i_8;
  int i_7;
  int k_2;
  int i_6;
  int i_5;
  uchar a_1;
  uchar b_2;
  uchar g_2;
  uchar r_2;
  int i_4;
  uchar a;
  uchar b_1;
  uchar g_1;
  uchar r_1;
  int k_1;
  int i_3;
  int i_2;
  uchar b;
  uchar g;
  int iStack_28;
  uchar r;
  int i_1;
  int i;
  int k;
  Vector4 *pixels;
  int newFormat_local;
  Image *image_local;
  
  if ((((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) &&
     ((newFormat != 0 && (image->format != newFormat)))) {
    if ((image->format < 0xb) && (newFormat < 0xb)) {
      uVar5 = image->width;
      uVar6 = image->height;
      uVar7 = image->mipmaps;
      uVar8 = image->format;
      image_00.height = uVar8;
      image_00.width = uVar7;
      image_00.data._4_4_ = uVar6;
      image_00.data._0_4_ = uVar5;
      image_00.mipmaps = in_stack_ffffffffffffff80;
      image_00.format = in_stack_ffffffffffffff84;
      __ptr = LoadImageDataNormalized(image_00);
      free(image->data);
      image->data = (void *)0x0;
      image->format = newFormat;
      i_1 = 0;
      switch(image->format) {
      case 1:
        pvVar9 = malloc((long)(image->width * image->height));
        image->data = pvVar9;
        for (iStack_28 = 0; iStack_28 < image->width * image->height; iStack_28 = iStack_28 + 1) {
          lVar11 = (long)iStack_28;
          *(char *)((long)image->data + (long)iStack_28) =
               (char)(int)((__ptr[lVar11].z * 0.114 +
                           __ptr[lVar11].x * 0.299 + __ptr[lVar11].y * 0.587) * 255.0);
        }
        break;
      case 2:
        pvVar9 = malloc((long)(image->width * image->height * 2));
        image->data = pvVar9;
        for (i_2 = 0; iVar10 = image->width * image->height,
            SBORROW4(i_2,iVar10 * 2) != i_2 + iVar10 * -2 < 0; i_2 = i_2 + 2) {
          lVar11 = (long)i_1;
          *(char *)((long)image->data + (long)i_2) =
               (char)(int)((__ptr[lVar11].z * 0.114 +
                           __ptr[lVar11].x * 0.299 + __ptr[lVar11].y * 0.587) * 255.0);
          *(char *)((long)image->data + (long)(i_2 + 1)) = (char)(int)(__ptr[i_1].w * 255.0);
          i_1 = i_1 + 1;
        }
        break;
      case 3:
        pvVar9 = malloc((long)(image->width * image->height) << 1);
        image->data = pvVar9;
        for (k_1 = 0; k_1 < image->width * image->height; k_1 = k_1 + 1) {
          dVar1 = round((double)(__ptr[k_1].x * 31.0));
          dVar2 = round((double)(__ptr[k_1].y * 63.0));
          dVar3 = round((double)(__ptr[k_1].z * 31.0));
          *(ushort *)((long)image->data + (long)k_1 * 2) =
               (ushort)(byte)(int)dVar1 << 0xb | (ushort)(byte)(int)dVar2 << 5 |
               (ushort)(byte)(int)dVar3;
        }
        break;
      case 4:
        pvVar9 = malloc((long)(image->width * image->height * 3));
        image->data = pvVar9;
        i_4 = 0;
        for (_a = 0; iVar10 = image->width * image->height,
            SBORROW4(_a,iVar10 * 3) != _a + iVar10 * -3 < 0; _a = _a + 3) {
          *(char *)((long)image->data + (long)_a) = (char)(int)(__ptr[i_4].x * 255.0);
          *(char *)((long)_a + 1 + (long)image->data) = (char)(int)(__ptr[i_4].y * 255.0);
          *(char *)((long)image->data + (long)(_a + 2)) = (char)(int)(__ptr[i_4].z * 255.0);
          i_4 = i_4 + 1;
        }
        break;
      case 5:
        pvVar9 = malloc((long)(image->width * image->height) << 1);
        image->data = pvVar9;
        for (i_5 = 0; i_5 < image->width * image->height; i_5 = i_5 + 1) {
          dVar1 = round((double)(__ptr[i_5].x * 31.0));
          dVar2 = round((double)(__ptr[i_5].y * 31.0));
          dVar3 = round((double)(__ptr[i_5].z * 31.0));
          *(ushort *)((long)image->data + (long)i_5 * 2) =
               (ushort)(byte)(int)dVar1 << 0xb | (ushort)(byte)(int)dVar2 << 6 |
               (ushort)(byte)(int)dVar3 << 1 | (ushort)(0.19607843 < __ptr[i_5].w);
        }
        break;
      case 6:
        pvVar9 = malloc((long)(image->width * image->height) << 1);
        image->data = pvVar9;
        for (k_2 = 0; k_2 < image->width * image->height; k_2 = k_2 + 1) {
          fVar12 = 15.0;
          dVar1 = round((double)(__ptr[k_2].x * 15.0));
          dVar2 = round((double)(__ptr[k_2].y * fVar12));
          dVar3 = round((double)(__ptr[k_2].z * fVar12));
          dVar4 = round((double)(__ptr[k_2].w * fVar12));
          *(ushort *)((long)image->data + (long)k_2 * 2) =
               (ushort)(byte)(int)dVar1 << 0xc | (ushort)(byte)(int)dVar2 << 8 |
               (ushort)(byte)(int)dVar3 << 4 | (ushort)(byte)(int)dVar4;
        }
        break;
      case 7:
        pvVar9 = malloc((long)(image->width * image->height * 4));
        image->data = pvVar9;
        i_8 = 0;
        for (i_7 = 0; i_7 < image->width * image->height * 4; i_7 = i_7 + 4) {
          *(char *)((long)image->data + (long)i_7) = (char)(int)(__ptr[i_8].x * 255.0);
          *(char *)((long)i_7 + 1 + (long)image->data) = (char)(int)(__ptr[i_8].y * 255.0);
          *(char *)((long)i_7 + 2 + (long)image->data) = (char)(int)(__ptr[i_8].z * 255.0);
          *(char *)((long)image->data + (long)(i_7 + 3)) = (char)(int)(__ptr[i_8].w * 255.0);
          i_8 = i_8 + 1;
        }
        break;
      case 8:
        pvVar9 = malloc((long)(image->width * image->height) << 2);
        image->data = pvVar9;
        for (k_3 = 0; k_3 < image->width * image->height; k_3 = k_3 + 1) {
          *(float *)((long)image->data + (long)k_3 * 4) =
               __ptr[k_3].z * 0.114 + __ptr[k_3].x * 0.299 + __ptr[k_3].y * 0.587;
        }
        break;
      case 9:
        pvVar9 = malloc((long)(image->width * image->height * 3) << 2);
        image->data = pvVar9;
        k_4 = 0;
        for (i_9 = 0; iVar10 = image->width * image->height,
            SBORROW4(i_9,iVar10 * 3) != i_9 + iVar10 * -3 < 0; i_9 = i_9 + 3) {
          *(float *)((long)image->data + (long)i_9 * 4) = __ptr[k_4].x;
          *(float *)((long)image->data + (long)(i_9 + 1) * 4) = __ptr[k_4].y;
          *(float *)((long)image->data + (long)(i_9 + 2) * 4) = __ptr[k_4].z;
          k_4 = k_4 + 1;
        }
        break;
      case 10:
        pvVar9 = malloc((long)(image->width * image->height * 4) << 2);
        image->data = pvVar9;
        local_68 = 0;
        for (local_64 = 0; local_64 < image->width * image->height * 4; local_64 = local_64 + 4) {
          *(float *)((long)image->data + (long)local_64 * 4) = __ptr[local_68].x;
          *(float *)((long)image->data + (long)(local_64 + 1) * 4) = __ptr[local_68].y;
          *(float *)((long)image->data + (long)(local_64 + 2) * 4) = __ptr[local_68].z;
          *(float *)((long)image->data + (long)(local_64 + 3) * 4) = __ptr[local_68].w;
          local_68 = local_68 + 1;
        }
      }
      free(__ptr);
      if ((1 < image->mipmaps) && (image->mipmaps = 1, image->data != (void *)0x0)) {
        ImageMipmaps(image);
      }
    }
    else {
      TraceLog(4,"IMAGE: Data format is compressed, can not be converted");
    }
  }
  return;
}

Assistant:

void ImageFormat(Image *image, int newFormat)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if ((newFormat != 0) && (image->format != newFormat))
    {
        if ((image->format < PIXELFORMAT_COMPRESSED_DXT1_RGB) && (newFormat < PIXELFORMAT_COMPRESSED_DXT1_RGB))
        {
            Vector4 *pixels = LoadImageDataNormalized(*image);     // Supports 8 to 32 bit per channel

            RL_FREE(image->data);      // WARNING! We loose mipmaps data --> Regenerated at the end...
            image->data = NULL;
            image->format = newFormat;

            int k = 0;

            switch (image->format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*sizeof(unsigned char));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f)*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*2*sizeof(unsigned char));

                    for (int i = 0; i < image->width*image->height*2; i += 2, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[k].x*0.299f + (float)pixels[k].y*0.587f + (float)pixels[k].z*0.114f)*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].w*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*63.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*3*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*31.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));
                        a = (pixels[i].w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*15.0f));
                        g = (unsigned char)(round(pixels[i].y*15.0f));
                        b = (unsigned char)(round(pixels[i].z*15.0f));
                        a = (unsigned char)(round(pixels[i].w*15.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*4*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                        ((unsigned char *)image->data)[i + 3] = (unsigned char)(pixels[k].w*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    // WARNING: Image is converted to GRAYSCALE eqeuivalent 32bit

                    image->data = (float *)RL_MALLOC(image->width*image->height*sizeof(float));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((float *)image->data)[i] = (float)(pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*3*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*4*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                        ((float *)image->data)[i + 3] = pixels[k].w;
                    }
                } break;
                default: break;
            }

            RL_FREE(pixels);
            pixels = NULL;

            // In case original image had mipmaps, generate mipmaps for formated image
            // NOTE: Original mipmaps are replaced by new ones, if custom mipmaps were used, they are lost
            if (image->mipmaps > 1)
            {
                image->mipmaps = 1;
            #if defined(SUPPORT_IMAGE_MANIPULATION)
                if (image->data != NULL) ImageMipmaps(image);
            #endif
            }
        }
        else TRACELOG(LOG_WARNING, "IMAGE: Data format is compressed, can not be converted");
    }
}